

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5BestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  int iVar1;
  int iVar2;
  sqlite3_module *psVar3;
  sqlite3_index_constraint *psVar4;
  long lVar5;
  bool bVar6;
  double local_118;
  double local_108;
  double local_f8;
  double local_e8;
  Constraint *pC_1;
  int iSort;
  Constraint *pC;
  int j;
  int iCol;
  sqlite3_index_constraint *p;
  int local_b0;
  int aColMap [3];
  Constraint aConstraint [5];
  int i;
  int iNext;
  int bHasMatch;
  int idxFlags;
  int nCol;
  Fts5Config *pConfig;
  Fts5Table *pTab;
  sqlite3_index_info *pInfo_local;
  sqlite3_vtab *pVTab_local;
  
  psVar3 = pVTab[1].pModule;
  iVar1 = *(int *)&psVar3->xBestIndex;
  iNext = 0;
  memcpy(aColMap + 1,&DAT_00298190,100);
  p._4_4_ = 0xffffffff;
  local_b0 = iVar1;
  aColMap[0] = iVar1 + 1;
  aConstraint[4].omit = 0;
  do {
    if (pInfo->nConstraint <= aConstraint[4].omit) {
      if (pInfo->nOrderBy == 1) {
        iVar1 = pInfo->aOrderBy->iColumn;
        if ((iVar1 == *(int *)&psVar3->xBestIndex + 1) && ((iNext & 1U) != 0)) {
          iNext = iNext | 0x20;
        }
        else if (iVar1 == -1) {
          iNext = iNext | 0x40;
        }
        if (((iNext & 0x60U) != 0) && (pInfo->orderByConsumed = 1, pInfo->aOrderBy->desc != '\0')) {
          iNext = iNext | 0x80;
        }
      }
      bVar6 = (iNext & 1U) == 0;
      if ((iNext & 4U) == 0) {
        if ((iNext & 0x18U) == 0x18) {
          local_f8 = 500.0;
          if (bVar6) {
            local_f8 = 250000.0;
          }
          pInfo->estimatedCost = local_f8;
        }
        else if ((iNext & 0x18U) == 0) {
          local_118 = 1000.0;
          if (bVar6) {
            local_118 = 1000000.0;
          }
          pInfo->estimatedCost = local_118;
        }
        else {
          local_108 = 750.0;
          if (bVar6) {
            local_108 = 750000.0;
          }
          pInfo->estimatedCost = local_108;
        }
      }
      else {
        local_e8 = 100.0;
        if (bVar6) {
          local_e8 = 10.0;
        }
        pInfo->estimatedCost = local_e8;
        if (bVar6) {
          fts5SetUniqueFlag(pInfo);
        }
      }
      aConstraint[4].iConsIndex = 1;
      for (aConstraint[4].omit = 0; aConstraint[4].omit < 5;
          aConstraint[4].omit = aConstraint[4].omit + 1) {
        lVar5 = (long)aConstraint[4].omit;
        if (-1 < aConstraint[lVar5].iCol) {
          pInfo->aConstraintUsage[aConstraint[lVar5].iCol].argvIndex = aConstraint[4].iConsIndex;
          pInfo->aConstraintUsage[aConstraint[lVar5].iCol].omit = (uchar)aConstraint[lVar5].fts5op;
          aConstraint[4].iConsIndex = aConstraint[4].iConsIndex + 1;
        }
      }
      pInfo->idxNum = iNext;
      return 0;
    }
    psVar4 = pInfo->aConstraint + aConstraint[4].omit;
    iVar2 = psVar4->iColumn;
    if ((((psVar4->op == '@') && (-1 < iVar2)) && (iVar2 <= iVar1)) ||
       ((psVar4->op == '\x02' && (iVar2 == iVar1)))) {
      if (psVar4->usable == '\0') {
        pInfo->estimatedCost = 1e+50;
        return 0;
      }
      iNext = iNext & 0xffffU | 1 | iVar2 << 0x10;
      aConstraint[0].iCol = aConstraint[4].omit;
    }
    else if (psVar4->op < 0x41) {
      for (pC._0_4_ = 1; (int)pC < 5; pC._0_4_ = (int)pC + 1) {
        lVar5 = (long)(int)pC;
        if (((iVar2 == *(int *)((long)&p + (long)aConstraint[lVar5].op * 4 + 4)) &&
            (((uint)psVar4->op & aConstraint[lVar5 + -1].omit) != 0)) && (psVar4->usable != '\0')) {
          aConstraint[lVar5].iCol = aConstraint[4].omit;
          iNext = aConstraint[lVar5 + -1].iConsIndex | iNext;
        }
      }
    }
    aConstraint[4].omit = aConstraint[4].omit + 1;
  } while( true );
}

Assistant:

static int fts5BestIndexMethod(sqlite3_vtab *pVTab, sqlite3_index_info *pInfo){
  Fts5Table *pTab = (Fts5Table*)pVTab;
  Fts5Config *pConfig = pTab->pConfig;
  const int nCol = pConfig->nCol;
  int idxFlags = 0;               /* Parameter passed through to xFilter() */
  int bHasMatch;
  int iNext;
  int i;

  struct Constraint {
    int op;                       /* Mask against sqlite3_index_constraint.op */
    int fts5op;                   /* FTS5 mask for idxFlags */
    int iCol;                     /* 0==rowid, 1==tbl, 2==rank */
    int omit;                     /* True to omit this if found */
    int iConsIndex;               /* Index in pInfo->aConstraint[] */
  } aConstraint[] = {
    {SQLITE_INDEX_CONSTRAINT_MATCH|SQLITE_INDEX_CONSTRAINT_EQ, 
                                    FTS5_BI_MATCH,    1, 1, -1},
    {SQLITE_INDEX_CONSTRAINT_MATCH|SQLITE_INDEX_CONSTRAINT_EQ, 
                                    FTS5_BI_RANK,     2, 1, -1},
    {SQLITE_INDEX_CONSTRAINT_EQ,    FTS5_BI_ROWID_EQ, 0, 0, -1},
    {SQLITE_INDEX_CONSTRAINT_LT|SQLITE_INDEX_CONSTRAINT_LE, 
                                    FTS5_BI_ROWID_LE, 0, 0, -1},
    {SQLITE_INDEX_CONSTRAINT_GT|SQLITE_INDEX_CONSTRAINT_GE, 
                                    FTS5_BI_ROWID_GE, 0, 0, -1},
  };

  int aColMap[3];
  aColMap[0] = -1;
  aColMap[1] = nCol;
  aColMap[2] = nCol+1;

  assert( SQLITE_INDEX_CONSTRAINT_EQ<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_GT<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_LE<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_GE<SQLITE_INDEX_CONSTRAINT_MATCH );
  assert( SQLITE_INDEX_CONSTRAINT_LE<SQLITE_INDEX_CONSTRAINT_MATCH );

  /* Set idxFlags flags for all WHERE clause terms that will be used. */
  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    int iCol = p->iColumn;

    if( (p->op==SQLITE_INDEX_CONSTRAINT_MATCH && iCol>=0 && iCol<=nCol)
     || (p->op==SQLITE_INDEX_CONSTRAINT_EQ && iCol==nCol)
    ){
      /* A MATCH operator or equivalent */
      if( p->usable ){
        idxFlags = (idxFlags & 0xFFFF) | FTS5_BI_MATCH | (iCol << 16);
        aConstraint[0].iConsIndex = i;
      }else{
        /* As there exists an unusable MATCH constraint this is an 
        ** unusable plan. Set a prohibitively high cost. */
        pInfo->estimatedCost = 1e50;
        return SQLITE_OK;
      }
    }else if( p->op<=SQLITE_INDEX_CONSTRAINT_MATCH ){
      int j;
      for(j=1; j<ArraySize(aConstraint); j++){
        struct Constraint *pC = &aConstraint[j];
        if( iCol==aColMap[pC->iCol] && (p->op & pC->op) && p->usable ){
          pC->iConsIndex = i;
          idxFlags |= pC->fts5op;
        }
      }
    }
  }

  /* Set idxFlags flags for the ORDER BY clause */
  if( pInfo->nOrderBy==1 ){
    int iSort = pInfo->aOrderBy[0].iColumn;
    if( iSort==(pConfig->nCol+1) && BitFlagTest(idxFlags, FTS5_BI_MATCH) ){
      idxFlags |= FTS5_BI_ORDER_RANK;
    }else if( iSort==-1 ){
      idxFlags |= FTS5_BI_ORDER_ROWID;
    }
    if( BitFlagTest(idxFlags, FTS5_BI_ORDER_RANK|FTS5_BI_ORDER_ROWID) ){
      pInfo->orderByConsumed = 1;
      if( pInfo->aOrderBy[0].desc ){
        idxFlags |= FTS5_BI_ORDER_DESC;
      }
    }
  }

  /* Calculate the estimated cost based on the flags set in idxFlags. */
  bHasMatch = BitFlagTest(idxFlags, FTS5_BI_MATCH);
  if( BitFlagTest(idxFlags, FTS5_BI_ROWID_EQ) ){
    pInfo->estimatedCost = bHasMatch ? 100.0 : 10.0;
    if( bHasMatch==0 ) fts5SetUniqueFlag(pInfo);
  }else if( BitFlagAllTest(idxFlags, FTS5_BI_ROWID_LE|FTS5_BI_ROWID_GE) ){
    pInfo->estimatedCost = bHasMatch ? 500.0 : 250000.0;
  }else if( BitFlagTest(idxFlags, FTS5_BI_ROWID_LE|FTS5_BI_ROWID_GE) ){
    pInfo->estimatedCost = bHasMatch ? 750.0 : 750000.0;
  }else{
    pInfo->estimatedCost = bHasMatch ? 1000.0 : 1000000.0;
  }

  /* Assign argvIndex values to each constraint in use. */
  iNext = 1;
  for(i=0; i<ArraySize(aConstraint); i++){
    struct Constraint *pC = &aConstraint[i];
    if( pC->iConsIndex>=0 ){
      pInfo->aConstraintUsage[pC->iConsIndex].argvIndex = iNext++;
      pInfo->aConstraintUsage[pC->iConsIndex].omit = (unsigned char)pC->omit;
    }
  }

  pInfo->idxNum = idxFlags;
  return SQLITE_OK;
}